

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O0

void testing_start_timer(testing t)

{
  int iVar1;
  nsync_time nVar2;
  nsync_time nVar3;
  __time_t local_40;
  __syscall_slong_t local_38;
  testing t_local;
  
  iVar1 = nsync::nsync_time_cmp(t->stop_time,(nsync_time)ZEXT816(0));
  if (iVar1 == 0) {
    abort();
  }
  nVar3 = t->start_time;
  nVar2 = nsync::nsync_time_now();
  nVar2 = nsync::nsync_time_sub(nVar2,t->stop_time);
  nVar3 = nsync::nsync_time_add(nVar3,nVar2);
  local_40 = nVar3.tv_sec;
  (t->start_time).tv_sec = local_40;
  local_38 = nVar3.tv_nsec;
  (t->start_time).tv_nsec = local_38;
  (t->stop_time).tv_sec = 0;
  (t->stop_time).tv_nsec = 0;
  return;
}

Assistant:

void testing_start_timer (testing t) {
	if (nsync_time_cmp (t->stop_time, nsync_time_zero) == 0) {
		abort ();
	}
	t->start_time = nsync_time_add (t->start_time,
		nsync_time_sub (nsync_time_now (), t->stop_time));
	t->stop_time = nsync_time_zero;
}